

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBB.cpp
# Opt level: O2

void __thiscall
chrono::collision::CHOBB::FitToGeometries
          (CHOBB *this,ChMatrix33<double> *O,
          vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
          *mgeos,int firstgeo,int ngeos,double envelope)

{
  ChGeometry *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChVector<double> v;
  ChVector<double> local_e8;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  ChMatrix33<double> local_98;
  undefined1 local_48 [16];
  double local_38;
  
  local_c8 = envelope;
  ChMatrix33<double>::ChMatrix33(&local_98,1.0);
  lVar5 = (long)firstgeo;
  uVar4 = (ulong)(uint)(~(ngeos >> 0x1f) & ngeos);
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  (this->Rot).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       1.79769313486232e+308;
  local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       1.79769313486232e+308;
  local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       1.79769313486232e+308;
  local_e8.m_data[0] = -1.79769313486232e+308;
  local_e8.m_data[1] = -1.79769313486232e+308;
  local_e8.m_data[2] = -1.79769313486232e+308;
  while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
    this_00 = (mgeos->
              super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar5];
    if (this_00 != (ChGeometry *)0x0) {
      geometry::ChGeometry::InflateBoundingBox
                (this_00,(ChVector<double> *)&local_98,&local_e8,&this->Rot);
    }
    lVar5 = lVar5 + 1;
  }
  auVar8._0_8_ = local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] + local_e8.m_data[0];
  auVar8._8_8_ = local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] + local_e8.m_data[1];
  auVar7._8_8_ = 0x3fe0000000000000;
  auVar7._0_8_ = 0x3fe0000000000000;
  local_48 = vmulpd_avx512vl(auVar8,auVar7);
  local_38 = (local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
             + local_e8.m_data[2]) * 0.5;
  ChMatrix33<double>::operator*(&this->Rot,(ChVector<double> *)local_48);
  if ((Vector *)&local_b8 != &this->To) {
    (this->To).m_data[0] = local_b8;
    (this->To).m_data[1] = dStack_b0;
    (this->To).m_data[2] = local_a8;
  }
  auVar2._8_8_ = local_e8.m_data[1];
  auVar2._0_8_ = local_e8.m_data[0];
  auVar3._8_8_ = local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar3._0_8_ = local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar7 = vsubpd_avx(auVar2,auVar3);
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar7 = vmulpd_avx512vl(auVar7,auVar1);
  (this->d).m_data[0] = auVar7._0_8_ + local_c8;
  (this->d).m_data[1] = auVar7._8_8_ + local_c8;
  (this->d).m_data[2] =
       (local_e8.m_data[2] -
       local_98.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]) * 0.5
       + local_c8;
  return;
}

Assistant:

void CHOBB::FitToGeometries(ChMatrix33<>& O,
                            std::vector<geometry::ChGeometry*> mgeos,
                            int firstgeo,
                            int ngeos,
                            double envelope) {
    // store orientation

    this->Rot = ChMatrix33<>(1);

    ChVector<> cmin(+std::numeric_limits<double>::max());
    ChVector<> cmax(-std::numeric_limits<double>::max());

    geometry::ChGeometry* nit;
    for (int count = 0; count < ngeos; ++count) {
        nit = mgeos[firstgeo + count];
        if (nit) {
            nit->InflateBoundingBox(cmin, cmax, Rot);
        }
    }

    ChVector<> c = (cmin + cmax) / 2;
    To = Rot * c;

    d = (cmax - cmin) / 2 + ChVector<>(envelope);
}